

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O0

bool __thiscall VideoHppGenerator::isExtension(VideoHppGenerator *this,string *name)

{
  bool bVar1;
  string *name_local;
  VideoHppGenerator *this_local;
  
  bVar1 = std::ranges::__any_of_fn::
          operator()<const_std::vector<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VideoHppGenerator_cpp:428:45)>
                    ((__any_of_fn *)&std::ranges::any_of,&this->m_extensions,name);
  return bVar1;
}

Assistant:

bool VideoHppGenerator::isExtension( std::string const & name ) const
{
  return std::ranges::any_of( m_extensions, [&name]( ExtensionData const & ed ) { return ed.name == name; } );
}